

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_uint64_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint w;
  int iVar5;
  long lVar6;
  word wVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = c->w64[0];
  uVar2 = c->w64[1];
  iVar5 = 2;
  do {
    wVar7 = v->w64[0];
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      uVar8 = (uint)wVar7;
      lVar3 = wVar7 << 0x3e;
      wVar7 = wVar7 >> 2;
      uVar9 = -(ulong)(uVar8 & 1);
      uVar4 = lVar3 >> 0x3f;
      uVar1 = uVar1 ^ *(ulong *)((long)A->w64 + lVar6 + 0x10) & uVar4 ^
                      *(ulong *)((long)A->w64 + lVar6) & uVar9;
      c->w64[0] = uVar1;
      uVar2 = uVar2 ^ uVar4 & *(ulong *)((long)A->w64 + lVar6 + 0x18) ^
                      uVar9 & *(ulong *)((long)A->w64 + lVar6 + 8);
      c->w64[1] = uVar2;
      lVar3 = lVar6 + 0x20;
    } while ((int)(lVar6 + 0x20) != 0x400);
    v = (mzd_local_t *)((long)v + 8);
    A = (mzd_local_t *)((long)A[1].w64 + lVar6);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 1) {
      const word mask1 = -(idx & 1);
      const word mask2 = -((idx >> 1) & 1);
      cblock->w64[0] ^= (Ablock->w64[0] & mask1) ^ (Ablock->w64[2] & mask2);
      cblock->w64[1] ^= (Ablock->w64[1] & mask1) ^ (Ablock->w64[3] & mask2);
    }
  }
}